

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O3

uint RDL_bitset_compressed(uchar **compressed,char *edges,uint size)

{
  uchar *puVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = ((size >> 3) + 1) - (uint)((size & 7) == 0);
  puVar1 = (uchar *)calloc(1,(ulong)uVar3);
  *compressed = puVar1;
  if (size != 0) {
    uVar2 = 0;
    do {
      if (edges[uVar2] != '\0') {
        (*compressed)[uVar2 >> 3 & 0x1fffffff] =
             (*compressed)[uVar2 >> 3 & 0x1fffffff] | '\x01' << ((byte)uVar2 & 7);
      }
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
  }
  return uVar3;
}

Assistant:

unsigned RDL_bitset_compressed(unsigned char** compressed, const char* edges, unsigned size)
{
  unsigned new_size, i;

  new_size = RDL_bitset_init(compressed, size);

  for (i = 0; i < size; ++i) {
    if (edges[i]) {
      RDL_bitset_set(*compressed, i);
    }
  }

  return new_size;
}